

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O3

int mk_sched_check_timeouts(mk_sched_worker *sched,mk_server *server)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_sched_conn *conn;
  
  pmVar1 = (sched->timeout_queue).next;
  while (pmVar2 = pmVar1, pmVar2 != &sched->timeout_queue) {
    pmVar1 = pmVar2->next;
    if ((((ulong)pmVar2[-0xb].prev & 0x1800000000) == 0) &&
       ((long)(server->timeout + *(int *)&pmVar2[-6].next) <=
        server->clock_context->log_current_utime)) {
      conn = (mk_sched_conn *)(pmVar2 + -0xb);
      (*(code *)pmVar2[-5].prev[1].prev)(conn,sched,0xffffffff,server);
      mk_sched_threads_destroy_conn(sched,conn);
      mk_sched_remove_client(conn,sched,server);
    }
  }
  return 0;
}

Assistant:

int mk_sched_check_timeouts(struct mk_sched_worker *sched,
                            struct mk_server *server)
{
    int client_timeout;
    struct mk_sched_conn *conn;
    struct mk_list *head;
    struct mk_list *temp;

    /* PENDING CONN TIMEOUT */
    mk_list_foreach_safe(head, temp, &sched->timeout_queue) {
        conn = mk_list_entry(head, struct mk_sched_conn, timeout_head);
        if (conn->event.type & MK_EVENT_IDLE) {
            continue;
        }

        client_timeout = conn->arrive_time + server->timeout;

        /* Check timeout */
        if (client_timeout <= server->clock_context->log_current_utime) {
            MK_TRACE("Scheduler, closing fd %i due TIMEOUT",
                     conn->event.fd);
            MK_LT_SCHED(conn->event.fd, "TIMEOUT_CONN_PENDING");
            conn->protocol->cb_close(conn, sched, MK_SCHED_CONN_TIMEOUT,
                                     server);
            mk_sched_drop_connection(conn, sched, server);
        }
    }

    return 0;
}